

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O2

void __thiscall Js::RuntimeFunction::SetFunctionNameId(RuntimeFunction *this,Var nameId)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  int32 propertyId;
  undefined4 *puVar3;
  
  if ((this->functionNameId).ptr != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                ,0x42,"(functionNameId == __null)","functionNameId == NULL");
    if (!bVar2) goto LAB_00be6af6;
    *puVar3 = 0;
  }
  bVar2 = TaggedInt::Is(nameId);
  if (!bVar2) {
    bVar2 = VarIs<Js::JavascriptString>(nameId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                  ,0x43,
                                  "(TaggedInt::Is(nameId) || Js::VarIs<Js::JavascriptString>(nameId))"
                                  ,
                                  "TaggedInt::Is(nameId) || Js::VarIs<Js::JavascriptString>(nameId)"
                                 );
      if (!bVar2) goto LAB_00be6af6;
      *puVar3 = 0;
    }
  }
  bVar2 = TaggedInt::Is(nameId);
  if (bVar2) {
    this_00 = (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.
                 ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    propertyId = TaggedInt::ToInt32(nameId);
    bVar2 = ScriptContext::IsTrackedPropertyId(this_00,propertyId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                  ,0x46,
                                  "(!TaggedInt::Is(nameId) || this->GetScriptContext()->IsTrackedPropertyId(TaggedInt::ToInt32(nameId)))"
                                  ,
                                  "!TaggedInt::Is(nameId) || this->GetScriptContext()->IsTrackedPropertyId(TaggedInt::ToInt32(nameId))"
                                 );
      if (!bVar2) {
LAB_00be6af6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  this->isDisplayString = false;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->functionNameId,nameId);
  return;
}

Assistant:

void
    RuntimeFunction::SetFunctionNameId(Var nameId)
    {
        Assert(functionNameId == NULL);
        Assert(TaggedInt::Is(nameId) || Js::VarIs<Js::JavascriptString>(nameId));

        // We are only reference the propertyId, it needs to be tracked to stay alive
        Assert(!TaggedInt::Is(nameId) || this->GetScriptContext()->IsTrackedPropertyId(TaggedInt::ToInt32(nameId)));
        this->isDisplayString = false;
        this->functionNameId = nameId;
    }